

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  size_type sVar3;
  size_type sVar4;
  size_type size1;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  value_type local_128;
  matrix<double,_remora::row_major,_remora::cpu_tag> Arow;
  matrix<double,_remora::row_major,_remora::cpu_tag> Crow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Bcol;
  matrix<double,_remora::column_major,_remora::cpu_tag> Acol;
  matrix<double,_remora::row_major,_remora::cpu_tag> Brow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Ccol;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Flops");
  std::endl<char,std::char_traits<char>>(poVar1);
  size1 = 100;
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix(&Arow,size1,size1);
    auVar7._8_4_ = (int)(size1 >> 0x20);
    auVar7._0_8_ = size1;
    auVar7._12_4_ = 0x45300000;
    dVar6 = 0.1 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)size1) - 4503599627370496.0));
    lVar2 = 0;
    for (sVar3 = 0; sVar3 != size1; sVar3 = sVar3 + 1) {
      for (sVar4 = 0; size1 != sVar4; sVar4 = sVar4 + 1) {
        *(double *)
         ((long)Arow.m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + sVar4 * 8 + Arow.m_size2 * lVar2) =
             (double)(long)sVar4 * dVar6 + (double)(long)sVar3 * dVar6;
      }
      lVar2 = lVar2 + 8;
    }
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix(&Brow,size1,size1);
    lVar2 = 0;
    for (sVar3 = 0; sVar3 != size1; sVar3 = sVar3 + 1) {
      for (sVar4 = 0; size1 != sVar4; sVar4 = sVar4 + 1) {
        *(double *)
         ((long)Brow.m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + sVar4 * 8 + Brow.m_size2 * lVar2) =
             (double)(long)sVar4 * dVar6 + (double)(long)sVar3 * dVar6;
      }
      lVar2 = lVar2 + 8;
    }
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              ((matrix<double,remora::column_major,remora::cpu_tag> *)&Acol,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)&Arow);
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              ((matrix<double,remora::column_major,remora::cpu_tag> *)&Bcol,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)&Brow);
    Ccol.m_size1 = 0;
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix
              (&Crow,size1,size1,(value_type *)&Ccol);
    local_128 = 0.0;
    remora::matrix<double,_remora::column_major,_remora::cpu_tag>::matrix
              (&Ccol,size1,size1,&local_128);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1,"\t row major results\t");
    dVar6 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Arow,(matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Brow,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Crow);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Acol,(matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Brow,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Crow);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Arow,(matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Bcol,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Crow);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Acol,(matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Bcol,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Crow);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1,"\t column major results\t");
    dVar6 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Arow,(matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Brow,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Ccol);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Acol,(matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Brow,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Ccol);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Arow,(matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Bcol,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Ccol);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"\t");
    dVar6 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Acol,(matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                                 *)&Bcol,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)&Ccol);
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    size1 = size1 * 2;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Ccol.m_data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Crow.m_data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Bcol.m_data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Acol.m_data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Brow.m_data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Arow.m_data.super__Vector_base<double,_std::allocator<double>_>);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::size_t size = 100;
	std::cout<<"Flops"<<std::endl;
	for(std::size_t iter = 0; iter != 5; ++iter){
		std::size_t middle = size;
		matrix<double,row_major> Arow(size,middle);
		for(std::size_t i = 0; i != size; ++i){
			for(std::size_t k = 0; k != middle; ++k){
				Arow(i,k)  = 0.1/size*i+0.1/size*k;
			}
		}

		matrix<double,row_major> Brow(middle,size);
		for(std::size_t k = 0; k != middle; ++k){
			for(std::size_t j = 0; j != size; ++j){
				Brow(k,j) = 0.1/size*j+0.1/size*k;
			}
		}
		matrix<double,column_major> Acol = Arow;
		matrix<double,column_major> Bcol = Brow;

		matrix<double,row_major> Crow(size,size,0.0);
		matrix<double,column_major> Ccol(size,size,0.0);
		std::cout<<size<<"\t row major results\t"<<benchmark(Arow,Brow,Crow)<<"\t"<< benchmark(Acol,Brow,Crow)
		<<"\t"<< benchmark(Arow,Bcol,Crow) <<"\t" <<benchmark(Acol,Bcol,Crow) <<std::endl;
		std::cout<<size<<"\t column major results\t"<<benchmark(Arow,Brow,Ccol)<<"\t"<< benchmark(Acol,Brow,Ccol)
		<<"\t"<< benchmark(Arow,Bcol,Ccol) <<"\t" <<benchmark(Acol,Bcol,Ccol) <<std::endl;
		size *=2;
	}
}